

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

bool Host_SendAllHere(void *userdata)

{
  uint uVar1;
  ulong uVar2;
  sockaddr_in *address;
  size_t __n;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  PreGamePacket packet;
  undefined2 local_74;
  char local_72;
  undefined1 local_71;
  undefined4 local_70;
  undefined2 uStack_6c;
  undefined1 auStack_6a [58];
  
  local_74 = 0x330;
  uVar2 = (ulong)(uint)(int)doomcom.numnodes;
  if (1 < doomcom.numnodes) {
    lVar7 = 1;
    lVar6 = 0;
    do {
      local_71 = (undefined1)lVar7;
      if (*(int *)((long)userdata + lVar7 * 4) == 0) {
        __n = 4;
        if (1 < (int)uVar2) {
          lVar3 = 0;
          iVar4 = 0;
          do {
            if (lVar6 != lVar3) {
              lVar5 = (long)iVar4;
              (&local_70)[lVar5 * 2] = *(undefined4 *)(sendaddress[1].sin_zero + lVar3 + -4);
              *(undefined2 *)(auStack_6a + lVar5 * 8 + -2) =
                   *(undefined2 *)(sendaddress[1].sin_zero + lVar3 + -6);
              auStack_6a[lVar5 * 8] = local_71;
              iVar4 = iVar4 + 1;
            }
            lVar3 = lVar3 + 0x10;
          } while ((uVar2 & 0xffffffff) * 0x10 + -0x10 != lVar3);
          __n = (size_t)(iVar4 * 8 + 4);
        }
        local_72 = (char)uVar2 + -2;
      }
      else {
        local_72 = '\0';
        __n = 4;
      }
      sendto(mysocket,&local_74,__n,0,(sockaddr *)(sendaddress + lVar7),0x10);
      lVar7 = lVar7 + 1;
      uVar2 = (ulong)doomcom.numnodes;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < (long)uVar2);
  }
  address = PreGet(&local_74,0x44,false);
  if (address != (sockaddr_in *)0x0) {
    do {
      if (((char)local_74 == '0') && (local_74._1_1_ == '\x06')) {
        uVar1 = FindNode(address);
        if ((-1 < (int)uVar1) && (*(int *)((long)userdata + (ulong)uVar1 * 4) == 0)) {
          *(undefined4 *)((long)userdata + (ulong)uVar1 * 4) = 1;
          *(int *)((long)userdata + 0x20) = *(int *)((long)userdata + 0x20) + 1;
        }
        sendto(mysocket,&local_74,2,0,(sockaddr *)address,0x10);
      }
      address = PreGet(&local_74,0x44,false);
    } while (address != (sockaddr_in *)0x0);
  }
  return *(int *)((long)userdata + 0x20) == doomcom.numnodes + -1;
}

Assistant:

bool Host_SendAllHere (void *userdata)
{
	int *gotack = (int *)userdata;	// ackcount is at gotack[MAXNETNODES]
	PreGamePacket packet;
	int node;
	sockaddr_in *from;

	// Send out address information to all guests. Guests that have already
	// acknowledged receipt effectively get just a heartbeat packet.
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_ALLHERE;
	for (node = 1; node < doomcom.numnodes; node++)
	{
		int machine, spot = 0;

		packet.ConsoleNum = node;
		if (!gotack[node])
		{
			for (spot = 0, machine = 1; machine < doomcom.numnodes; machine++)
			{
				if (node != machine)
				{
					packet.machines[spot].address = sendaddress[machine].sin_addr.s_addr;
					packet.machines[spot].port = sendaddress[machine].sin_port;
					packet.machines[spot].player = node;

					spot++;	// fixes problem of new address replacing existing address in
							// array; it's supposed to increment the index before getting
							// and storing in the packet the next address.
				}
			}
			packet.NumNodes = doomcom.numnodes - 2;
		}
		else
		{
			packet.NumNodes = 0;
		}
		PreSend (&packet, 4 + spot*8, &sendaddress[node]);
	}

	// Check for replies.
	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake == PRE_FAKE && packet.Message == PRE_ALLHEREACK)
		{
			node = FindNode (from);
			if (node >= 0)
			{
				if (!gotack[node])
				{
					gotack[node] = true;
					gotack[MAXNETNODES]++;
				}
			}
			PreSend (&packet, 2, from);
		}
	}

	// If everybody has replied, then this loop can end.
	return gotack[MAXNETNODES] == doomcom.numnodes - 1;
}